

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

char * openjtalk_getVoicePathSjis(OpenJTalk *oj,char *path)

{
  char *pcVar1;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if (oj->fn_voice_path[0] != '\0') {
      pcVar1 = u8tosjis_path(oj->fn_voice_path,path);
      return pcVar1;
    }
    oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
  }
  return (char *)0x0;
}

Assistant:

OPENJTALK_DLL_API char *OPENJTALK_CONVENTION openjtalk_getVoicePathSjis(OpenJTalk *oj, char *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!oj->fn_voice_path || strlen(oj->fn_voice_path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return NULL;
	}
#if defined(_WIN32)
	char *res = u8tosjis_path(oj->fn_voice_path, path);
#else
	char *res = u8tosjis_path(oj->fn_voice_path, path);
#endif
	return res;
}